

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

void __thiscall cereal::JSONInputArchive::Iterator::search(Iterator *this,char *searchName)

{
  int iVar1;
  size_t __n;
  Ch *__s2;
  size_t sVar2;
  Exception *this_00;
  size_t sVar3;
  Pointer this_01;
  allocator<char> local_91;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  __n = strlen(searchName);
  this_01 = (this->itsMemberItBegin).ptr_;
  sVar3 = 0;
  do {
    if (this_01 == (this->itsMemberItEnd).ptr_) {
      this_00 = (Exception *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,searchName,&local_91);
      std::operator+(&local_70,"JSON Parsing failed - provided NVP (",&local_90);
      std::operator+(&local_50,&local_70,") not found");
      Exception::Exception(this_00,&local_50);
      __cxa_throw(this_00,&Exception::typeinfo,std::runtime_error::~runtime_error);
    }
    __s2 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
           ::GetString(&this_01->name);
    iVar1 = strncmp(searchName,__s2,__n);
    if (iVar1 == 0) {
      sVar2 = strlen(__s2);
      if (sVar2 == __n) {
        this->itsIndex = sVar3;
        return;
      }
    }
    this_01 = this_01 + 1;
    sVar3 = sVar3 + 1;
  } while( true );
}

Assistant:

inline void search( const char * searchName )
          {
            const auto len = std::strlen( searchName );
            size_t index = 0;
            for( auto it = itsMemberItBegin; it != itsMemberItEnd; ++it, ++index )
            {
              const auto currentName = it->name.GetString();
              if( ( std::strncmp( searchName, currentName, len ) == 0 ) &&
                  ( std::strlen( currentName ) == len ) )
              {
                itsIndex = index;
                return;
              }
            }

            throw Exception("JSON Parsing failed - provided NVP (" + std::string(searchName) + ") not found");
          }